

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O0

bool __thiscall
docopt::OneOrMore::match
          (OneOrMore *this,PatternList *left,
          vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
          *collected)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  long in_RDI;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *in_stack_00000008;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *in_stack_00000010;
  bool firstLoop;
  PatternList l_;
  size_t times;
  bool matched;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  c;
  PatternList l;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint uVar4;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  *in_stack_ffffffffffffff80;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *in_stack_ffffffffffffff88;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *in_stack_ffffffffffffff90;
  long local_68;
  byte local_5d;
  undefined1 local_50 [8];
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  *in_stack_ffffffffffffffb8;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  *in_stack_ffffffffffffffc0;
  undefined1 local_38 [55];
  byte local_1;
  
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            *)in_stack_ffffffffffffffc0,
           (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            *)in_stack_ffffffffffffffb8);
  std::
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  ::vector(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_5d = 1;
  local_68 = 0;
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            *)0x2b4cc4);
  uVar4 = CONCAT13(1,(int3)in_stack_ffffffffffffff7c);
  while (local_5d != 0) {
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    operator[]((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                *)(in_RDI + 8),0);
    peVar3 = std::__shared_ptr_access<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2b4cee);
    uVar2 = (*peVar3->_vptr_Pattern[2])(peVar3,local_38,local_50);
    local_5d = (byte)uVar2 & 1;
    if ((uVar2 & 1) != 0) {
      local_68 = local_68 + 1;
    }
    if ((uVar4 & 0x1000000) == 0) {
      bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      if (bVar1) break;
    }
    else {
      uVar4 = uVar4 & 0xffffff;
    }
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    operator=(in_stack_00000010,in_stack_00000008);
  }
  if (local_68 != 0) {
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    operator=((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               *)in_stack_ffffffffffffff80,
              (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               *)CONCAT44(uVar4,in_stack_ffffffffffffff78));
    std::
    vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    ::operator=(in_stack_ffffffffffffff80,
                (vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                 *)CONCAT44(uVar4,in_stack_ffffffffffffff78));
  }
  local_1 = local_68 != 0;
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)in_stack_ffffffffffffff80);
  std::
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  ::~vector(in_stack_ffffffffffffff80);
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)in_stack_ffffffffffffff80);
  return (bool)(local_1 & 1);
}

Assistant:

bool OneOrMore::match(PatternList& left, std::vector<std::shared_ptr<LeafPattern>>& collected) const
{
	assert(fChildren.size() == 1);
	
	auto l = left;
	auto c = collected;
	
	bool matched = true;
	size_t times = 0;
	
	decltype(l) l_;
	bool firstLoop = true;
	
	while (matched) {
		// could it be that something didn't match but changed l or c?
		matched = fChildren[0]->match(l, c);
		
		if (matched)
			++times;
		
		if (firstLoop) {
			firstLoop = false;
		} else if (l == l_) {
			break;
		}
		
		l_ = l;
	}
	
	if (times == 0) {
		return false;
	}
	
	left = std::move(l);
	collected = std::move(c);
	return true;
}